

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O2

bool __thiscall TCLAP::CmdLine::_emptyCombined(CmdLine *this,string *s)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  if ((uVar3 != 0) && (*pcVar2 != '-')) {
    return false;
  }
  uVar5 = 1;
  do {
    bVar4 = uVar3 <= uVar5;
    if (uVar3 <= uVar5) {
      return bVar4;
    }
    pcVar1 = pcVar2 + uVar5;
    uVar5 = uVar5 + 1;
  } while (*pcVar1 == '\a');
  return bVar4;
}

Assistant:

inline bool CmdLine::_emptyCombined(const std::string& s)
{
	if ( s.length() > 0 && s[0] != Arg::flagStartChar() )
		return false;

	for ( int i = 1; static_cast<unsigned int>(i) < s.length(); i++ )
		if ( s[i] != Arg::blankChar() )
			return false;

	return true;
}